

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O2

_Bool gravity_hash_remove(gravity_hash_t *hashtable,gravity_value_t key)

{
  gravity_hash_iterate_fn p_Var1;
  hash_node_t *__ptr;
  ulong uVar2;
  _Bool _Var3;
  uint32_t uVar4;
  hash_node_s **pphVar5;
  hash_node_t *phVar6;
  
  uVar4 = (*hashtable->compute_fn)(key);
  uVar2 = (ulong)uVar4 % (ulong)hashtable->size;
  p_Var1 = hashtable->free_fn;
  pphVar5 = hashtable->nodes + uVar2;
  phVar6 = (hash_node_t *)0x0;
  do {
    __ptr = *pphVar5;
    if (__ptr == (hash_node_t *)0x0) {
LAB_00127fa0:
      return __ptr != (hash_node_t *)0x0;
    }
    if (__ptr->hash == uVar4) {
      _Var3 = (*hashtable->isequal_fn)(key,__ptr->key);
      if (_Var3) {
        if (p_Var1 != (gravity_hash_iterate_fn)0x0) {
          (*p_Var1)(hashtable,__ptr->key,__ptr->value,hashtable->data);
        }
        if (phVar6 == (hash_node_t *)0x0) {
          pphVar5 = hashtable->nodes + uVar2;
        }
        else {
          pphVar5 = &phVar6->next;
        }
        *pphVar5 = __ptr->next;
        free(__ptr);
        hashtable->count = hashtable->count - 1;
        goto LAB_00127fa0;
      }
    }
    pphVar5 = &__ptr->next;
    phVar6 = __ptr;
  } while( true );
}

Assistant:

bool gravity_hash_remove (gravity_hash_t *hashtable, gravity_value_t key) {
    register uint32_t hash = hashtable->compute_fn(key);
    register uint32_t position = hash % hashtable->size;

    gravity_hash_iterate_fn free_fn = hashtable->free_fn;
    hash_node_t *node = hashtable->nodes[position];
    hash_node_t *prevnode = NULL;
    while (node) {
        if ((node->hash == hash) && (hashtable->isequal_fn(key, node->key))) {
            if (free_fn) free_fn(hashtable, node->key, node->value, hashtable->data);
            if (prevnode) prevnode->next = node->next;
            else hashtable->nodes[position] = node->next;
            mem_free(node);
            hashtable->count--;
            return true;
        }

        prevnode = node;
        node = node->next;
    }

    return false;
}